

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-think-dungeon-util.c
# Opt level: O1

_Bool borg_think_stair_scum(_Bool from_town)

{
  uint8_t uVar1;
  loc grid;
  _Bool _Var2;
  borg_need bVar3;
  square *psVar5;
  loc_conflict lVar6;
  wchar_t wVar4;
  loc_conflict lVar7;
  short sVar8;
  uint uVar9;
  wchar_t wVar10;
  ulong uVar11;
  wchar_t wVar12;
  long lVar13;
  keycode_t k;
  borg_grid *pbVar14;
  long lVar15;
  bool bVar16;
  
  pbVar14 = borg_grids[borg.c.y] + borg.c.x;
  grid.y = borg.c.y;
  grid.x = borg.c.x;
  psVar5 = square(cave,grid);
  uVar1 = psVar5->feat;
  borg_notice(true);
  if ((borg.trait[0x69] == 0) || (borg.trait[0x6c] != 0)) {
    borg_note("# Leaving Scumming Mode. (Town or Weak)");
    borg.lunal_mode = false;
  }
  else {
    if (borg_items[(int)(~borg.trait[0x9e] + (uint)z_info->pack_size)].iqty != '\0') {
      return false;
    }
    if (uVar1 == '\x05') {
      if (pbVar14->feat != '\x05') {
        sVar8 = track_less.num;
        uVar9 = 0;
        if (0 < sVar8) {
          uVar9 = track_less._0_4_;
        }
        if ((-1 < sVar8) && ((short)uVar9 < track_less.size)) {
          uVar11 = (ulong)((uVar9 & 0xffff) << 2);
          *(int *)((long)track_less.x + uVar11) = borg.c.x;
          *(int *)((long)track_less.y + uVar11) = borg.c.y;
          track_less.num = sVar8 + 1;
        }
        pbVar14->feat = '\x05';
      }
    }
    else if ((uVar1 == '\x06') && (pbVar14->feat != '\x06')) {
      uVar9 = (uint)track_more.num;
      if (track_more.num < 1) {
        uVar11 = 0;
      }
      else {
        uVar11 = 0;
        do {
          if ((track_more.x[uVar11] == borg.c.x) && (track_more.y[uVar11] == borg.c.y))
          goto LAB_002464ca;
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
        uVar11 = (ulong)uVar9;
      }
LAB_002464ca:
      if (((uint)uVar11 == uVar9) && ((int)(uint)uVar11 < (int)track_more.size)) {
        track_more.x[uVar11 & 0xffffffff] = borg.c.x;
        track_more.y[uVar11 & 0xffffffff] = borg.c.y;
        track_more.num = track_more.num + 1;
      }
      pbVar14->feat = '\x06';
    }
    bVar3 = borg_maintain_light();
    if (bVar3 == BORG_MET_NEED) {
      return true;
    }
    if (bVar3 == BORG_UNMET_NEED) {
      borg_note("# Scum. (need fuel)");
    }
    _Var2 = borg_flow_old(L'\x02');
    if (_Var2) {
      return true;
    }
    _Var2 = borg_flow_take_scum(true,L'\x06');
    if (_Var2) {
      return true;
    }
    borg_note("# Fleeing level. Scumming Mode");
    borg.goal.fleeing = true;
    wVar12 = L'\xffffffff';
    if ((track_more.num != 0) && (((byte)(pbVar14->feat - 5) < 2 || (borg.trait[0x69] < 0x1e)))) {
      if (1 < track_more.num) {
        borg_note("# Scumming Mode: I know of a down stair.");
      }
      if (track_more.num < 1) {
        wVar12 = L'\xffffffff';
      }
      else {
        wVar12 = L'\xffffffff';
        lVar15 = 0;
        do {
          lVar6 = loc(track_more.x[lVar15],track_more.y[lVar15]);
          lVar7.y = borg.c.y;
          lVar7.x = borg.c.x;
          wVar4 = distance(lVar7,lVar6);
          wVar10 = wVar4;
          if (wVar12 < wVar4) {
            wVar10 = wVar12;
          }
          bVar16 = wVar12 == L'\xffffffff';
          wVar12 = wVar10;
          if (bVar16) {
            wVar12 = wVar4;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < track_more.num);
      }
      if (((wVar12 < L'\b') || (pbVar14->feat == '\x06')) || (borg.trait[0x69] < 0x1e)) {
        borg_note("# Scumming Mode.  Power Diving. ");
        _Var2 = borg_flow_old(L'\a');
        if (_Var2) {
          return true;
        }
        _Var2 = borg_flow_stair_more(7,false,false);
        if (_Var2) {
          return true;
        }
        if (pbVar14->feat == '\x06') {
          k = 0x3e;
          goto LAB_002466aa;
        }
      }
    }
    if (((track_less.num != 0) && (borg.trait[0x69] != 1)) && ((byte)(pbVar14->feat - 5) < 2)) {
      lVar15 = (long)borg.c.x;
      pbVar14 = borg_grids[borg.c.y];
      if (0 < track_less.num) {
        lVar13 = 0;
        do {
          lVar7 = loc(track_less.x[lVar13],track_less.y[lVar13]);
          lVar6.y = borg.c.y;
          lVar6.x = borg.c.x;
          wVar4 = distance(lVar6,lVar7);
          wVar10 = wVar4;
          if (wVar12 < wVar4) {
            wVar10 = wVar12;
          }
          bVar16 = wVar12 == L'\xffffffff';
          wVar12 = wVar10;
          if (bVar16) {
            wVar12 = wVar4;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < track_less.num);
      }
      if ((wVar12 < L'\b') || (pbVar14[lVar15].feat == '\x05')) {
        borg_note("# Scumming Mode.  Power Climb. ");
        borg.goal.less = true;
        _Var2 = borg_flow_old(L'\a');
        if (_Var2) {
          return true;
        }
        _Var2 = borg_flow_stair_less(7,false);
        if (_Var2) {
          borg_note("# Looking for stairs. Scumming Mode.");
          return true;
        }
        if ((pbVar14[lVar15].feat == '\x05') && ((player->opts).opt[0x20] == false)) {
          k = 0x3c;
LAB_002466aa:
          borg_keypress(k);
          return true;
        }
      }
    }
    if (1 < borg.trait[0x69]) {
      _Var2 = borg_flow_old(L'\a');
      if (_Var2) {
        return true;
      }
      borg_note("# Scumming Mode.  Any Stair. ");
      _Var2 = borg_flow_stair_both(7,true);
      if (_Var2) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool borg_think_stair_scum(bool from_town)
{
    int j, b_j = -1;
    int i;

    borg_grid *ag = &borg_grids[borg.c.y][borg.c.x];

    uint8_t feat  = square(cave, borg.c)->feat;

    enum borg_need need;

    /* examine equipment and swaps */
    borg_notice(true);

    /* No scumming mode if starving or in town */
    if (borg.trait[BI_CDEPTH] == 0 || borg.trait[BI_ISWEAK]) {
        borg_note("# Leaving Scumming Mode. (Town or Weak)");
        borg.lunal_mode = false;
        return false;
    }

    /* No scumming if inventory is full.  Require one empty slot */
    if (borg_items[PACK_SLOTS - 1].iqty)
        return false;

    /* if borg is just starting on this level, he may not
     * know that a stair is under him.  Cheat to see if one is
     * there
     */
    if (feat == FEAT_MORE && ag->feat != FEAT_MORE) {

        /* Check for an existing "down stairs" */
        for (i = 0; i < track_more.num; i++) {
            /* We already knew about that one */
            if ((track_more.x[i] == borg.c.x) && (track_more.y[i] == borg.c.y))
                break;
        }

        /* Track the newly discovered "down stairs" */
        if ((i == track_more.num) && (i < track_more.size)) {
            track_more.x[i] = borg.c.x;
            track_more.y[i] = borg.c.y;
            track_more.num++;
        }
        /* tell the array */
        ag->feat = FEAT_MORE;
    }

    if (feat == FEAT_LESS && ag->feat != FEAT_LESS) {

        /* Check for an existing "up stairs" */
        for (i = 0; i < track_less.num; i++) {
            /* We already knew about this one */
            if ((track_less.x[i] == borg.c.x) && (track_less.y[i] == borg.c.y))
                continue;
        }

        /* Track the newly discovered "up stairs" */
        if ((i == track_less.num) && (i < track_less.size)) {
            track_less.x[i] = borg.c.x;
            track_less.y[i] = borg.c.y;
            track_less.num++;
        }

        /* Tell the array */
        ag->feat = FEAT_LESS;
    }

    /** First deal with staying alive **/

    /* Hack -- require light */
    need = borg_maintain_light();
    if (need == BORG_MET_NEED)
        return true;
    else if (need == BORG_UNMET_NEED)
        borg_note("# Scum. (need fuel)");

    /** Track down some interesting gear **/
    /* XXX Should we allow him great flexibility in retrieving loot? (not always
     * safe?)*/
    /* Continue flowing towards objects */
    if (borg_flow_old(GOAL_TAKE))
        return true;

    /* Find a (viewable) object */
    if (borg_flow_take_scum(true, 6))
        return true;

    /*leave level right away. */
    borg_note("# Fleeing level. Scumming Mode");
    borg.goal.fleeing = true;

    /* Scumming Mode - Going down */
    if (track_more.num
        && (ag->feat == FEAT_MORE || ag->feat == FEAT_LESS
            || borg.trait[BI_CDEPTH] < 30)) {
        int y, x;

        if (track_more.num >= 2)
            borg_note("# Scumming Mode: I know of a down stair.");

        /* Check for an existing "down stairs" */
        for (i = 0; i < track_more.num; i++) {
            x = track_more.x[i];
            y = track_more.y[i];

            /* How far is the nearest down stairs */
            j = distance(borg.c, loc(x, y));

            /* skip the far ones */
            if (b_j <= j && b_j != -1)
                continue;

            /* track it */
            b_j = j;
        }

        /* if the downstair is close and path is safe, continue on */
        if (b_j < 8 || ag->feat == FEAT_MORE || borg.trait[BI_CDEPTH] < 30) {
            /* Note */
            borg_note("# Scumming Mode.  Power Diving. ");

            /* Continue leaving the level */
            if (borg_flow_old(GOAL_FLEE))
                return true;

            /* Flow to DownStair */
            if (borg_flow_stair_more(GOAL_FLEE, false, false))
                return true;

            /* if standing on a stair */
            if (ag->feat == FEAT_MORE) {
                /* Take the DownStair */
                borg_keypress('>');

                return true;
            }
        }
    }

    /* Scumming Mode - Going up */
    if (track_less.num && borg.trait[BI_CDEPTH] != 1
        && (ag->feat == FEAT_MORE || ag->feat == FEAT_LESS)) {
        int y, x;

        borg_grid *tmp_ag = &borg_grids[borg.c.y][borg.c.x];

        /* Check for an existing "up stairs" */
        for (i = 0; i < track_less.num; i++) {
            x = track_less.x[i];
            y = track_less.y[i];

            /* How far is the nearest up stairs */
            j = distance(borg.c, loc(x, y));

            /* skip the far ones */
            if (b_j <= j && b_j != -1)
                continue;

            /* track it */
            b_j = j;
        }

        /* if the upstair is close and safe path, continue */
        if (b_j < 8 || tmp_ag->feat == FEAT_LESS) {

            /* Note */
            borg_note("# Scumming Mode.  Power Climb. ");

            /* Set to help borg move better */
            borg.goal.less = true;

            /* Continue leaving the level */
            if (borg_flow_old(GOAL_FLEE))
                return true;

            /* Flow to UpStair */
            if (borg_flow_stair_less(GOAL_FLEE, false)) {
                borg_note("# Looking for stairs. Scumming Mode.");

                /* Success */
                return true;
            }

            if (tmp_ag->feat == FEAT_LESS && !OPT(player, birth_force_descend)) {
                /* Take the Up Stair */
                borg_keypress('<');
                return true;
            }
        }
    }

    /* Special case where the borg is off a stair and there
     * is a monster in LOS.  He could freeze and unhook, or
     * move to the closest stair and risk the run.
     */
    if (borg.trait[BI_CDEPTH] >= 2) {
        /* Continue fleeing to stair */
        if (borg_flow_old(GOAL_FLEE))
            return true;

        /* Note */
        borg_note("# Scumming Mode.  Any Stair. ");

        /* Try to find some stairs */
        if (borg_flow_stair_both(GOAL_FLEE, true))
            return true;
    }

    /* return to normal borg_think_dungeon */
    return false;
}